

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::WriteGroups
          (cmExtraEclipseCDT4Generator *this,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups,string *linkName,
          cmXMLWriter *xml)

{
  const_iterator cVar1;
  bool bVar2;
  pointer pcVar3;
  char *pcVar4;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *this_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  reference ppcVar5;
  string local_148;
  string local_128;
  undefined1 local_108 [8];
  string linkName4;
  string *fullPath;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_d8;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_d0;
  const_iterator fileIt;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *children;
  string local_a0;
  char local_7a [2];
  char *local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_58 [8];
  string linkName3;
  __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
  local_30;
  const_iterator sgIt;
  cmXMLWriter *xml_local;
  string *linkName_local;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups_local;
  cmExtraEclipseCDT4Generator *this_local;
  
  sgIt._M_current = (cmSourceGroup *)xml;
  local_30._M_current =
       (cmSourceGroup *)
       std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin(sourceGroups);
  while( true ) {
    linkName3.field_2._8_8_ =
         std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end(sourceGroups);
    bVar2 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                        *)((long)&linkName3.field_2 + 8));
    if (!bVar2) break;
    std::__cxx11::string::string((string *)local_58,(string *)linkName);
    std::__cxx11::string::operator+=((string *)local_58,"/");
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
             ::operator->(&local_30);
    pcVar4 = cmSourceGroup::GetFullName(pcVar3);
    std::__cxx11::string::operator+=((string *)local_58,pcVar4);
    local_70._M_current = (char *)std::__cxx11::string::begin();
    local_78 = (char *)std::__cxx11::string::end();
    local_7a[1] = 0x5c;
    local_7a[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_70,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_78,local_7a + 1,local_7a);
    cVar1 = sgIt;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a0,"virtual:/virtual",(allocator *)((long)&children + 7));
    AppendLinkedResource((cmXMLWriter *)cVar1._M_current,(string *)local_58,&local_a0,VirtualFolder)
    ;
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&children + 7));
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
             ::operator->(&local_30);
    this_00 = cmSourceGroup::GetGroupChildren(pcVar3);
    bVar2 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::empty(this_00);
    if (!bVar2) {
      WriteGroups(this,this_00,linkName,(cmXMLWriter *)sgIt._M_current);
    }
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
             ::operator->(&local_30);
    __x = cmSourceGroup::GetSourceFiles(pcVar3);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&fileIt,__x);
    local_d8._M_current =
         (cmSourceFile **)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&fileIt);
    __gnu_cxx::
    __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
    ::__normal_iterator<cmSourceFile_const**>
              ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                *)&local_d0,&local_d8);
    while( true ) {
      fullPath = (string *)
                 std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                           ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            &fileIt);
      bVar2 = __gnu_cxx::operator!=
                        (&local_d0,
                         (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                          *)&fullPath);
      if (!bVar2) break;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&local_d0);
      linkName4.field_2._8_8_ = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar5);
      bVar2 = cmsys::SystemTools::FileIsDirectory((string *)linkName4.field_2._8_8_);
      if (!bVar2) {
        std::__cxx11::string::string((string *)local_108,(string *)local_58);
        std::__cxx11::string::operator+=((string *)local_108,"/");
        cmsys::SystemTools::GetFilenameName(&local_128,(string *)linkName4.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_108,(string *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        cVar1 = sgIt;
        GetEclipsePath(&local_148,(string *)linkName4.field_2._8_8_);
        AppendLinkedResource
                  ((cmXMLWriter *)cVar1._M_current,(string *)local_108,&local_148,LinkToFile);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)local_108);
      }
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&local_d0);
    }
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&fileIt);
    std::__cxx11::string::~string((string *)local_58);
    __gnu_cxx::
    __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::WriteGroups(
  std::vector<cmSourceGroup> const& sourceGroups, std::string& linkName,
  cmXMLWriter& xml)
{
  for (std::vector<cmSourceGroup>::const_iterator sgIt = sourceGroups.begin();
       sgIt != sourceGroups.end(); ++sgIt) {
    std::string linkName3 = linkName;
    linkName3 += "/";
    linkName3 += sgIt->GetFullName();

    std::replace(linkName3.begin(), linkName3.end(), '\\', '/');

    this->AppendLinkedResource(xml, linkName3, "virtual:/virtual",
                               VirtualFolder);
    std::vector<cmSourceGroup> const& children = sgIt->GetGroupChildren();
    if (!children.empty()) {
      this->WriteGroups(children, linkName, xml);
    }
    std::vector<const cmSourceFile*> sFiles = sgIt->GetSourceFiles();
    for (std::vector<const cmSourceFile*>::const_iterator fileIt =
           sFiles.begin();
         fileIt != sFiles.end(); ++fileIt) {
      std::string const& fullPath = (*fileIt)->GetFullPath();

      if (!cmSystemTools::FileIsDirectory(fullPath)) {
        std::string linkName4 = linkName3;
        linkName4 += "/";
        linkName4 += cmSystemTools::GetFilenameName(fullPath);
        this->AppendLinkedResource(xml, linkName4,
                                   this->GetEclipsePath(fullPath), LinkToFile);
      }
    }
  }
}